

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void transformTest(void)

{
  ostream *poVar1;
  iterator pvVar2;
  iterator pvVar3;
  iterator pvVar4;
  iterator pvVar5;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar6;
  value_type_conflict2 *v_2;
  iterator __end2_2;
  iterator __begin2_2;
  value_type *__range2_2;
  value_type *row_2;
  iterator __end1_2;
  iterator __begin1_2;
  array<std::array<float,_8UL>,_8UL> *__range1_2;
  array<std::array<float,_8UL>,_8UL> icoeff;
  value_type_conflict2 *v_1;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  value_type *row_1;
  iterator __end1_1;
  iterator __begin1_1;
  array<std::array<float,_8UL>,_8UL> *__range1_1;
  array<std::array<float,_8UL>,_8UL> coeff;
  value_type_conflict *v;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  value_type *row;
  iterator __end1;
  iterator __begin1;
  array<std::array<int,_8UL>,_8UL> *__range1;
  array<std::array<int,_8UL>,_8UL> mat;
  iterator local_3b0;
  iterator local_390;
  array<std::array<float,_8UL>,_8UL> *in_stack_fffffffffffffc90;
  array<std::array<int,_8UL>,_8UL> *in_stack_fffffffffffffca0;
  float *local_270;
  iterator local_250;
  int *local_130;
  iterator local_110;
  undefined1 local_100 [256];
  
  memcpy(local_100,&DAT_00176bd8,0x100);
  poVar1 = std::operator<<((ostream *)&std::cout,"Original block:-");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_110 = std::array<std::array<int,_8UL>,_8UL>::begin
                        ((array<std::array<int,_8UL>,_8UL> *)0x145dbf);
  pvVar2 = std::array<std::array<int,_8UL>,_8UL>::end((array<std::array<int,_8UL>,_8UL> *)0x145dd4);
  for (; local_110 != pvVar2; local_110 = local_110 + 1) {
    local_130 = std::array<int,_8UL>::begin((array<int,_8UL> *)0x145e1f);
    pvVar3 = std::array<int,_8UL>::end((array<int,_8UL> *)0x145e34);
    for (; local_130 != pvVar3; local_130 = local_130 + 1) {
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*local_130);
      std::operator<<(poVar1,"\t");
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  DCTTest(in_stack_fffffffffffffca0);
  poVar1 = std::operator<<((ostream *)&std::cout,"\nAfter DCT:-");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_250 = std::array<std::array<float,_8UL>,_8UL>::begin
                        ((array<std::array<float,_8UL>,_8UL> *)0x145f19);
  pvVar4 = std::array<std::array<float,_8UL>,_8UL>::end
                     ((array<std::array<float,_8UL>,_8UL> *)0x145f2e);
  for (; local_250 != pvVar4; local_250 = local_250 + 1) {
    local_270 = std::array<float,_8UL>::begin((array<float,_8UL> *)0x145f79);
    pvVar5 = std::array<float,_8UL>::end((array<float,_8UL> *)0x145f8e);
    for (; local_270 != pvVar5; local_270 = local_270 + 1) {
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*local_270);
      std::operator<<(poVar1,"\t");
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  IDCTTest(in_stack_fffffffffffffc90);
  poVar1 = std::operator<<((ostream *)&std::cout,"\nAfter IDCT:-");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_390 = std::array<std::array<float,_8UL>,_8UL>::begin
                        ((array<std::array<float,_8UL>,_8UL> *)0x146069);
  pvVar4 = std::array<std::array<float,_8UL>,_8UL>::end
                     ((array<std::array<float,_8UL>,_8UL> *)0x146078);
  for (; local_390 != pvVar4; local_390 = local_390 + 1) {
    local_3b0 = std::array<float,_8UL>::begin((array<float,_8UL> *)0x1460ab);
    pvVar5 = std::array<float,_8UL>::end((array<float,_8UL> *)0x1460ba);
    for (; local_3b0 != pvVar5; local_3b0 = local_3b0 + 1) {
      lVar6 = in_ST6;
      roundl();
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,in_ST0);
      std::operator<<(poVar1,"\t");
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = lVar6;
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void transformTest()
{
    std::array<std::array<int, 8>, 8> mat 
    {
        std::array<int, 8>{ 52, 55, 61, 66, 70, 61, 64, 73 },
        std::array<int, 8>{ 63, 59, 55, 90, 109, 85, 69, 72 },
        std::array<int, 8>{ 62, 59, 68, 113, 144, 104, 66, 73 },
        std::array<int, 8>{ 63, 58, 71, 122, 154, 106, 70, 69 },
        std::array<int, 8>{ 67, 61, 68, 104, 126, 88, 68, 70 },
        std::array<int, 8>{ 79, 65, 60, 70, 77, 68, 58, 75 },
        std::array<int, 8>{ 85, 71, 64, 59, 55, 61, 65, 83 },
        std::array<int, 8>{ 87, 79, 69, 68, 65, 76, 78, 94 }
    };
    
    std::cout << "Original block:-" << std::endl;
    for (auto&& row: mat )
    {
        for ( auto&& v : row )
            std::cout << v << "\t";
        std::cout << std::endl;
    }
    
    auto coeff = DCTTest( mat );
    
    std::cout << "\nAfter DCT:-" << std::endl;
    
    for (auto&& row: coeff )
    {
        for ( auto&& v : row )
            std::cout << v << "\t";
        std::cout << std::endl;
    }
    
    auto icoeff = IDCTTest( coeff );
    
    std::cout << "\nAfter IDCT:-" << std::endl;
    
    for (auto&& row: icoeff )
    {
        for ( auto&& v : row )
            std::cout << std::roundl( v ) << "\t";
        std::cout << std::endl;
    }
}